

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void divide_subset_split<float,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double split_point,MissingAction missing_action,size_t *st_NA,
               size_t *end_NA,size_t *split_ix)

{
  ulong *puVar1;
  ulong *puVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  size_t *r;
  size_t sVar6;
  ulong *puVar7;
  size_t *psVar8;
  ulong uVar9;
  int *piVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  
  uVar20 = (ulong)Xc_indptr[col_num];
  uVar12 = (ulong)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    sVar6 = end + 1;
    if (split_point < 0.0) {
      sVar6 = st;
    }
    psVar8 = split_ix;
    if (missing_action != Fail) {
      *st_NA = sVar6;
      psVar8 = end_NA;
    }
    *psVar8 = sVar6;
  }
  puVar2 = ix_arr + st;
  puVar14 = ix_arr + end + 1;
  uVar17 = (long)puVar14 - (long)puVar2 >> 3;
  puVar7 = puVar2;
  if (0 < (long)uVar17) {
    do {
      uVar18 = uVar17 >> 1;
      uVar19 = ~uVar18 + uVar17;
      uVar17 = uVar18;
      if (puVar7[uVar18] < (ulong)(long)Xc_ind[uVar20]) {
        puVar7 = puVar7 + uVar18 + 1;
        uVar17 = uVar19;
      }
    } while (0 < (long)uVar17);
  }
  uVar17 = uVar12 - 1;
  sVar6 = (long)puVar7 - (long)ix_arr >> 3;
  if (puVar7 <= puVar2) {
    sVar6 = st;
  }
  uVar18 = (ulong)Xc_ind[uVar12 - 1];
  puVar2 = ix_arr + end;
  if (split_point < 0.0) {
    sVar6 = st;
  }
  if (missing_action == Fail) {
    end_NA = split_ix;
    if (split_point < 0.0) {
      if ((puVar7 != puVar14) && (uVar12 != uVar20)) {
        while (uVar19 = *puVar7, uVar19 <= uVar18) {
          piVar11 = Xc_ind + uVar20;
          iVar3 = *piVar11;
          if (iVar3 == (int)uVar19) {
            if ((double)Xc[uVar20] <= split_point) {
              uVar9 = ix_arr[st];
              ix_arr[st] = uVar19;
              *puVar7 = uVar9;
              st = st + 1;
            }
            if ((puVar7 == puVar2) || (uVar20 == uVar17)) break;
            piVar10 = piVar11 + 1;
            puVar7 = puVar7 + 1;
            uVar20 = (long)((long)Xc_ind + (uVar12 * 4 - (long)piVar10)) >> 2;
            if (0 < (long)uVar20) {
              do {
                uVar19 = uVar20 >> 1;
                uVar9 = ~uVar19 + uVar20;
                uVar20 = uVar19;
                if ((ulong)(long)piVar10[uVar19] < *puVar7) {
                  piVar10 = piVar10 + uVar19 + 1;
                  uVar20 = uVar9;
                }
              } while (0 < (long)uVar20);
            }
LAB_00268355:
            uVar20 = (long)piVar10 - (long)Xc_ind >> 2;
          }
          else {
            if (iVar3 <= (int)uVar19) {
              piVar10 = piVar11 + 1;
              uVar20 = (long)((long)Xc_ind + (uVar12 * 4 - (long)(piVar11 + 1))) >> 2;
              while (0 < (long)uVar20) {
                uVar9 = uVar20 >> 1;
                uVar16 = ~uVar9 + uVar20;
                uVar20 = uVar9;
                if ((ulong)(long)piVar10[uVar9] < uVar19) {
                  piVar10 = piVar10 + uVar9 + 1;
                  uVar20 = uVar16;
                }
              }
              goto LAB_00268355;
            }
            puVar7 = puVar7 + 1;
            uVar19 = (long)puVar14 - (long)puVar7 >> 3;
            while (0 < (long)uVar19) {
              uVar9 = uVar19 >> 1;
              uVar16 = ~uVar9 + uVar19;
              uVar19 = uVar9;
              if (puVar7[uVar9] < (ulong)(long)iVar3) {
                puVar7 = puVar7 + uVar9 + 1;
                uVar19 = uVar16;
              }
            }
          }
          if ((puVar7 == puVar14) || (uVar20 == uVar12)) break;
        }
      }
    }
    else {
      while (st = sVar6, puVar7 != puVar14) {
        if (uVar12 <= uVar20) goto LAB_00268054;
        piVar11 = Xc_ind + uVar20;
        iVar3 = *piVar11;
        uVar18 = *puVar7;
        if (iVar3 == (int)uVar18) {
          if ((double)Xc[uVar20] <= split_point) {
            uVar19 = ix_arr[st];
            ix_arr[st] = uVar18;
            *puVar7 = uVar19;
            st = st + 1;
          }
          puVar1 = puVar7 + 1;
          if (((puVar7 < puVar2) && (puVar1 <= puVar2)) && (puVar15 = puVar1, uVar20 == uVar17)) {
            do {
              uVar18 = ix_arr[st];
              ix_arr[st] = *puVar15;
              *puVar15 = uVar18;
              st = st + 1;
              puVar15 = puVar15 + 1;
            } while (puVar15 <= puVar2);
          }
          if ((uVar20 == uVar17) || (puVar7 == puVar2)) break;
          piVar11 = piVar11 + 1;
          uVar20 = (long)((long)Xc_ind + (uVar12 * 4 - (long)piVar11)) >> 2;
          if (0 < (long)uVar20) {
            do {
              uVar18 = uVar20 >> 1;
              uVar19 = ~uVar18 + uVar20;
              uVar20 = uVar18;
              if ((ulong)(long)piVar11[uVar18] < *puVar1) {
                piVar11 = piVar11 + uVar18 + 1;
                uVar20 = uVar19;
              }
            } while (0 < (long)uVar20);
          }
          uVar20 = (long)piVar11 - (long)Xc_ind >> 2;
          puVar7 = puVar1;
          sVar6 = st;
        }
        else if ((int)uVar18 < iVar3) {
          for (; (sVar6 = st, puVar7 <= puVar2 && ((int)*puVar7 < iVar3)); puVar7 = puVar7 + 1) {
            uVar18 = ix_arr[st];
            ix_arr[st] = *puVar7;
            *puVar7 = uVar18;
            st = st + 1;
          }
        }
        else {
          piVar10 = piVar11 + 1;
          uVar20 = (long)((long)Xc_ind + (uVar12 * 4 - (long)(piVar11 + 1))) >> 2;
          while (0 < (long)uVar20) {
            uVar19 = uVar20 >> 1;
            uVar9 = ~uVar19 + uVar20;
            uVar20 = uVar19;
            if ((ulong)(long)piVar10[uVar19] < uVar18) {
              piVar10 = piVar10 + uVar19 + 1;
              uVar20 = uVar9;
            }
          }
          uVar20 = (long)piVar10 - (long)Xc_ind >> 2;
          sVar6 = st;
        }
      }
    }
    goto LAB_00268392;
  }
  if (split_point < 0.0) {
    sVar6 = st;
    if ((puVar7 != puVar14) && (uVar12 != uVar20)) {
      bVar5 = false;
      uVar19 = uVar20;
      while (uVar9 = *puVar7, uVar9 <= uVar18) {
        piVar11 = Xc_ind + uVar19;
        iVar3 = *piVar11;
        if (iVar3 == (int)uVar9) {
          if (NAN(Xc[uVar19])) {
            bVar5 = true;
          }
          else if ((double)Xc[uVar19] <= split_point) {
            uVar16 = ix_arr[st];
            ix_arr[st] = uVar9;
            *puVar7 = uVar16;
            st = st + 1;
          }
          if ((puVar7 == puVar2) || (uVar19 == uVar17)) break;
          piVar11 = piVar11 + 1;
          puVar7 = puVar7 + 1;
          uVar19 = (long)((long)Xc_ind + (uVar12 * 4 - (long)piVar11)) >> 2;
          if (0 < (long)uVar19) {
            do {
              uVar9 = uVar19 >> 1;
              uVar16 = ~uVar9 + uVar19;
              uVar19 = uVar9;
              if ((ulong)(long)piVar11[uVar9] < *puVar7) {
                piVar11 = piVar11 + uVar9 + 1;
                uVar19 = uVar16;
              }
            } while (0 < (long)uVar19);
          }
          uVar19 = (long)piVar11 - (long)Xc_ind >> 2;
        }
        else if ((int)uVar9 < iVar3) {
          puVar7 = puVar7 + 1;
          uVar9 = (long)puVar14 - (long)puVar7 >> 3;
          while (0 < (long)uVar9) {
            uVar16 = uVar9 >> 1;
            uVar13 = ~uVar16 + uVar9;
            uVar9 = uVar16;
            if (puVar7[uVar16] < (ulong)(long)iVar3) {
              puVar7 = puVar7 + uVar16 + 1;
              uVar9 = uVar13;
            }
          }
        }
        else {
          piVar10 = piVar11 + 1;
          uVar19 = (long)((long)Xc_ind + (uVar12 * 4 - (long)(piVar11 + 1))) >> 2;
          while (0 < (long)uVar19) {
            uVar16 = uVar19 >> 1;
            uVar13 = ~uVar16 + uVar19;
            uVar19 = uVar16;
            if ((ulong)(long)piVar10[uVar16] < uVar9) {
              piVar10 = piVar10 + uVar16 + 1;
              uVar19 = uVar13;
            }
          }
          uVar19 = (long)piVar10 - (long)Xc_ind >> 2;
        }
        if ((puVar7 == puVar14) || (uVar19 == uVar12)) break;
      }
      goto LAB_00267d03;
    }
  }
  else if (puVar7 != puVar14) {
    bVar5 = false;
    st = sVar6;
    uVar19 = uVar20;
    do {
      if (uVar12 <= uVar19) goto LAB_00267cfe;
      piVar11 = Xc_ind + uVar19;
      iVar3 = *piVar11;
      uVar9 = *puVar7;
      if (iVar3 == (int)uVar9) {
        if (NAN(Xc[uVar19])) {
          bVar5 = true;
        }
        else if ((double)Xc[uVar19] <= split_point) {
          uVar16 = ix_arr[st];
          ix_arr[st] = uVar9;
          *puVar7 = uVar16;
          st = st + 1;
        }
        puVar1 = puVar7 + 1;
        if (((puVar7 < puVar2) && (puVar1 <= puVar2)) && (puVar15 = puVar1, uVar19 == uVar17)) {
          do {
            uVar9 = ix_arr[st];
            ix_arr[st] = *puVar15;
            *puVar15 = uVar9;
            st = st + 1;
            puVar15 = puVar15 + 1;
          } while (puVar15 <= puVar2);
        }
        if ((uVar19 == uVar17) || (puVar7 == puVar2)) break;
        piVar11 = piVar11 + 1;
        uVar19 = (long)((long)Xc_ind + (uVar12 * 4 - (long)piVar11)) >> 2;
        if (0 < (long)uVar19) {
          do {
            uVar16 = uVar19 >> 1;
            uVar9 = ~uVar16 + uVar19;
            uVar19 = uVar16;
            if ((ulong)(long)piVar11[uVar16] < *puVar1) {
              piVar11 = piVar11 + uVar16 + 1;
              uVar19 = uVar9;
            }
          } while (0 < (long)uVar19);
        }
        uVar19 = (long)piVar11 - (long)Xc_ind >> 2;
        puVar7 = puVar1;
      }
      else if ((int)uVar9 < iVar3) {
        for (; (puVar7 <= puVar2 && ((int)*puVar7 < iVar3)); puVar7 = puVar7 + 1) {
          uVar9 = ix_arr[st];
          ix_arr[st] = *puVar7;
          *puVar7 = uVar9;
          st = st + 1;
        }
      }
      else {
        piVar10 = piVar11 + 1;
        uVar19 = (long)((long)Xc_ind + (uVar12 * 4 - (long)(piVar11 + 1))) >> 2;
        while (0 < (long)uVar19) {
          uVar16 = uVar19 >> 1;
          uVar13 = ~uVar16 + uVar19;
          uVar19 = uVar16;
          if ((ulong)(long)piVar10[uVar16] < uVar9) {
            piVar10 = piVar10 + uVar16 + 1;
            uVar19 = uVar13;
          }
        }
        uVar19 = (long)piVar10 - (long)Xc_ind >> 2;
      }
    } while (puVar7 != puVar14);
LAB_00267d03:
    *st_NA = st;
    if ((bVar5) && (puVar7 = ix_arr + st, puVar7 != puVar14)) {
      uVar19 = (long)puVar14 - (long)puVar7 >> 3;
      lVar4 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar14,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(puVar7,puVar14);
      if (uVar12 != uVar20) {
        while (uVar19 = *puVar7, uVar19 <= uVar18) {
          piVar11 = Xc_ind + uVar20;
          iVar3 = *piVar11;
          if (iVar3 == (int)uVar19) {
            if (NAN(Xc[uVar20])) {
              uVar9 = ix_arr[st];
              ix_arr[st] = uVar19;
              *puVar7 = uVar9;
              st = st + 1;
            }
            if ((puVar7 == puVar2) || (uVar20 == uVar17)) break;
            piVar10 = piVar11 + 1;
            puVar7 = puVar7 + 1;
            uVar20 = (long)((long)Xc_ind + (uVar12 * 4 - (long)piVar10)) >> 2;
            if (0 < (long)uVar20) {
              do {
                uVar19 = uVar20 >> 1;
                uVar9 = ~uVar19 + uVar20;
                uVar20 = uVar19;
                if ((ulong)(long)piVar10[uVar19] < *puVar7) {
                  piVar10 = piVar10 + uVar19 + 1;
                  uVar20 = uVar9;
                }
              } while (0 < (long)uVar20);
            }
LAB_00267e8c:
            uVar20 = (long)piVar10 - (long)Xc_ind >> 2;
          }
          else {
            if (iVar3 <= (int)uVar19) {
              piVar10 = piVar11 + 1;
              uVar20 = (long)((long)Xc_ind + (uVar12 * 4 - (long)(piVar11 + 1))) >> 2;
              while (0 < (long)uVar20) {
                uVar9 = uVar20 >> 1;
                uVar16 = ~uVar9 + uVar20;
                uVar20 = uVar9;
                if ((ulong)(long)piVar10[uVar9] < uVar19) {
                  piVar10 = piVar10 + uVar9 + 1;
                  uVar20 = uVar16;
                }
              }
              goto LAB_00267e8c;
            }
            puVar7 = puVar7 + 1;
            uVar19 = (long)puVar14 - (long)puVar7 >> 3;
            while (0 < (long)uVar19) {
              uVar9 = uVar19 >> 1;
              uVar16 = ~uVar9 + uVar19;
              uVar19 = uVar9;
              if ((puVar7 + uVar9 + 1)[-1] < (ulong)(long)iVar3) {
                puVar7 = puVar7 + uVar9 + 1;
                uVar19 = uVar16;
              }
            }
          }
          if ((puVar7 == puVar14) || (uVar20 == uVar12)) break;
        }
      }
    }
    goto LAB_00268392;
  }
  *st_NA = sVar6;
  st = sVar6;
LAB_00268392:
  *end_NA = st;
  return;
LAB_00268054:
  for (; puVar7 <= puVar2; puVar7 = puVar7 + 1) {
    uVar20 = ix_arr[st];
    ix_arr[st] = *puVar7;
    *puVar7 = uVar20;
    st = st + 1;
  }
  goto LAB_00268392;
LAB_00267cfe:
  for (; puVar7 <= puVar2; puVar7 = puVar7 + 1) {
    uVar19 = ix_arr[st];
    ix_arr[st] = *puVar7;
    *puVar7 = uVar19;
    st = st + 1;
  }
  goto LAB_00267d03;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}